

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O3

BamIndex *
BamTools::Internal::BamIndexFactory::CreateIndexFromFilename
          (string *indexFilename,BamReaderPrivate *reader)

{
  int iVar1;
  BamToolsIndex *this;
  bool bVar2;
  string extension;
  undefined1 *local_60;
  size_t local_58;
  undefined1 local_50 [16];
  string local_40;
  
  FileExtension(&local_40,indexFilename);
  if (local_40._M_string_length != 0) {
    BamStandardIndex::Extension_abi_cxx11_();
    if (local_40._M_string_length == local_58) {
      if (local_40._M_string_length == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_40._M_dataplus._M_p,local_60,local_40._M_string_length);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    if (bVar2) {
      this = (BamToolsIndex *)operator_new(0x68);
      BamStandardIndex::BamStandardIndex((BamStandardIndex *)this,reader);
      goto LAB_001971de;
    }
    BamToolsIndex::Extension_abi_cxx11_();
    if (local_40._M_string_length == local_58) {
      if (local_40._M_string_length == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_40._M_dataplus._M_p,local_60,local_40._M_string_length);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
    if (bVar2) {
      this = (BamToolsIndex *)operator_new(0x68);
      BamToolsIndex::BamToolsIndex(this,reader);
      goto LAB_001971de;
    }
  }
  this = (BamToolsIndex *)0x0;
LAB_001971de:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return &this->super_BamIndex;
}

Assistant:

BamIndex* BamIndexFactory::CreateIndexFromFilename(const std::string& indexFilename,
                                                   BamReaderPrivate* reader)
{

    // get file extension from index filename, including dot (".EXT")
    // if can't get file extension, return null index
    const std::string extension = FileExtension(indexFilename);
    if (extension.empty()) return 0;

    // create index based on extension
    if (extension == BamStandardIndex::Extension())
        return new BamStandardIndex(reader);
    else if (extension == BamToolsIndex::Extension())
        return new BamToolsIndex(reader);
    else
        return 0;
}